

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O3

int matras_touch_reserve(matras *m,int count)

{
  matras_view *pmVar1;
  int iVar2;
  
  if (count < 0) {
    __assert_fail("count >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x159,"int matras_touch_reserve(struct matras *, int)");
  }
  if (((count != 0) && (pmVar1 = (m->head).prev_view, pmVar1 != (matras_view *)0x0)) &&
     (pmVar1->block_count != 0)) {
    iVar2 = matras_allocator_reserve
                      (m->allocator,(uint)((m->head).root == pmVar1->root) + count * 2);
    return iVar2;
  }
  return 0;
}

Assistant:

int
matras_touch_reserve(struct matras *m, int count)
{
	assert(count >= 0);

	/* No `matras_touch` calls planned. */
	if (count == 0)
		return 0;

	/* No view opened, the `matras_touch` will be a no-op. */
	if (!m->head.prev_view)
		return 0;

	/* The previous view is empty, the `matras_touch` will be a no-op. */
	if (m->head.prev_view->block_count == 0)
		return 0;

	/* The root is only copied once - on the first touch. */
	bool root_is_to_be_copied = m->head.root == m->head.prev_view->root;

	/* We have extents on 2 levels to possibly be copied after root. */
	int max_extents_required = count * 2 + root_is_to_be_copied;
	return matras_allocator_reserve(m->allocator, max_extents_required);
}